

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContext.cpp
# Opt level: O2

Header * __thiscall
Imf_3_4::Context::header(Header *__return_storage_ptr__,Context *this,int partidx)

{
  byte bVar1;
  uint uVar2;
  exr_attr_chlist_t *peVar3;
  exr_attr_preview_t *peVar4;
  V2f *pVVar5;
  exr_attr_keycode_t *peVar6;
  float *__first;
  exr_attr_chlist_entry_t *peVar7;
  long lVar8;
  exr_attr_opaquedata_t *peVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ChannelList *this_00;
  Attribute *attribute;
  char *pcVar14;
  ArgExc *pAVar15;
  ostream *poVar16;
  LogicExc *this_01;
  int c;
  long lVar17;
  long lVar18;
  long lVar19;
  exr_attribute_t *cur;
  int local_274;
  Context *local_270;
  int32_t attrcnt;
  stringstream _iex_throw_s;
  float fStack_25c;
  ostream local_250 [24];
  void *local_238;
  double local_230;
  char *local_228;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  svec;
  V2f local_50;
  V2f local_48;
  V2f local_40;
  V2f local_38;
  
  __iex_throw_s = 0.0;
  fStack_25c = 0.0;
  Header::Header(__return_storage_ptr__,0x40,0x40,1.0,(V2f *)&_iex_throw_s,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
  attrcnt = 0;
  cur = (exr_attribute_t *)0x0;
  local_274 = partidx;
  local_270 = this;
  iVar11 = exr_get_attribute_count
                     (*(this->_ctxt).
                       super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      partidx);
  if (iVar11 != 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar16 = std::operator<<(local_250,"Unable to get attribute for part ");
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,local_274);
    poVar16 = std::operator<<(poVar16," in file \'");
    pcVar14 = fileName(local_270);
    poVar16 = std::operator<<(poVar16,pcVar14);
    std::operator<<(poVar16,"\'");
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar11 = 0;
  while( true ) {
    if (attrcnt <= iVar11) {
      return __return_storage_ptr__;
    }
    iVar12 = exr_get_attribute_by_index
                       (*(local_270->_ctxt).
                         super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,local_274,0,iVar11,&cur);
    if (iVar12 != 0) break;
    switch(cur->type) {
    case EXR_ATTR_BOX2I:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(cur->field_6).chlist;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((cur->field_6).chlist)->entries;
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)&_iex_throw_s,
                 (Box<Imath_3_2::Vec2<int>_> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<int>_>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_BOX2F:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(cur->field_6).chlist;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((cur->field_6).chlist)->entries;
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)&_iex_throw_s,
                 (Box<Imath_3_2::Vec2<float>_> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Box<Imath_3_2::Vec2<float>_>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_CHLIST:
      this_00 = Header::channels(__return_storage_ptr__);
      lVar18 = 0x1c;
      for (lVar17 = 0; lVar17 < ((cur->field_6).chlist)->num_channels; lVar17 = lVar17 + 1) {
        peVar7 = ((cur->field_6).chlist)->entries;
        pcVar14 = *(char **)(peVar7->reserved + lVar18 + -0x29);
        Channel::Channel((Channel *)&_iex_throw_s,*(PixelType *)(peVar7->reserved + lVar18 + -0x21),
                         *(int *)(peVar7->reserved + lVar18 + -0x19),
                         *(int *)(peVar7->reserved + lVar18 + -0x15),
                         peVar7->reserved[lVar18 + -0x1d] != '\0');
        ChannelList::insert(this_00,pcVar14,(Channel *)&_iex_throw_s);
        lVar18 = lVar18 + 0x20;
      }
      break;
    case EXR_ATTR_CHROMATICITIES:
      pcVar14 = cur->name;
      pVVar5 = (V2f *)(cur->field_6).m33d;
      local_50 = *pVVar5;
      local_38 = pVVar5[1];
      local_40 = pVVar5[2];
      local_48 = pVVar5[3];
      Chromaticities::Chromaticities
                ((Chromaticities *)&svec,&local_50,&local_38,&local_40,&local_48);
      TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Chromaticities> *)&_iex_throw_s,(Chromaticities *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::Chromaticities>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Chromaticities> *)&_iex_throw_s);
      break;
    case EXR_ATTR_COMPRESSION:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)(cur->field_6).uc
                            );
      TypedAttribute<Imf_3_4::Compression>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Compression> *)&_iex_throw_s,(Compression *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::Compression>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Compression> *)&_iex_throw_s);
      break;
    case EXR_ATTR_DOUBLE:
      pcVar14 = cur->name;
      TypedAttribute<double>::TypedAttribute
                ((TypedAttribute<double> *)&_iex_throw_s,&(cur->field_6).d);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<double>::~TypedAttribute((TypedAttribute<double> *)&_iex_throw_s);
      break;
    case EXR_ATTR_ENVMAP:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)(cur->field_6).uc
                            );
      TypedAttribute<Imf_3_4::Envmap>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Envmap> *)&_iex_throw_s,(Envmap *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::Envmap>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Envmap> *)&_iex_throw_s);
      break;
    case EXR_ATTR_FLOAT:
      pcVar14 = cur->name;
      TypedAttribute<float>::TypedAttribute
                ((TypedAttribute<float> *)&_iex_throw_s,&(cur->field_6).f);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<float>::~TypedAttribute((TypedAttribute<float> *)&_iex_throw_s);
      break;
    case EXR_ATTR_FLOAT_VECTOR:
      pcVar14 = cur->name;
      __first = ((cur->field_6).floatvector)->arr;
      std::vector<float,std::allocator<float>>::vector<float_const*,void>
                ((vector<float,std::allocator<float>> *)&svec,__first,
                 __first + ((cur->field_6).floatvector)->length,(allocator_type *)&local_50);
      TypedAttribute<std::vector<float,_std::allocator<float>_>_>::TypedAttribute
                ((TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)&_iex_throw_s,
                 (vector<float,_std::allocator<float>_> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<std::vector<float,_std::allocator<float>_>_>::~TypedAttribute
                ((TypedAttribute<std::vector<float,_std::allocator<float>_>_> *)&_iex_throw_s);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                ((_Vector_base<float,_std::allocator<float>_> *)&svec);
      break;
    case EXR_ATTR_INT:
      pcVar14 = cur->name;
      TypedAttribute<int>::TypedAttribute((TypedAttribute<int> *)&_iex_throw_s,&(cur->field_6).i);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&_iex_throw_s);
      break;
    case EXR_ATTR_KEYCODE:
      pcVar14 = cur->name;
      peVar6 = (cur->field_6).keycode;
      KeyCode::KeyCode((KeyCode *)&svec,peVar6->film_mfc_code,peVar6->film_type,peVar6->prefix,
                       peVar6->count,peVar6->perf_offset,peVar6->perfs_per_frame,
                       peVar6->perfs_per_count);
      TypedAttribute<Imf_3_4::KeyCode>::TypedAttribute
                ((TypedAttribute<Imf_3_4::KeyCode> *)&_iex_throw_s,(KeyCode *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::KeyCode>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::KeyCode> *)&_iex_throw_s);
      break;
    case EXR_ATTR_LINEORDER:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)(cur->field_6).uc
                            );
      TypedAttribute<Imf_3_4::LineOrder>::TypedAttribute
                ((TypedAttribute<Imf_3_4::LineOrder> *)&_iex_throw_s,(LineOrder *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::LineOrder>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::LineOrder> *)&_iex_throw_s);
      break;
    case EXR_ATTR_M33F:
      pcVar14 = cur->name;
      Imath_3_2::Matrix33<float>::Matrix33<float[3][3],_0>
                ((Matrix33<float> *)&svec,(float (*) [3] [3])(cur->field_6).m33f);
      TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<float>_> *)&_iex_throw_s,
                 (Matrix33<float> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Matrix33<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<float>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_M33D:
      pcVar14 = cur->name;
      Imath_3_2::Matrix33<double>::Matrix33<double[3][3],_0>
                ((Matrix33<double> *)&svec,(double (*) [3] [3])(cur->field_6).m33d);
      TypedAttribute<Imath_3_2::Matrix33<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<double>_> *)&_iex_throw_s,
                 (Matrix33<double> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Matrix33<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix33<double>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_M44F:
      pcVar14 = cur->name;
      Imath_3_2::Matrix44<float>::Matrix44<float[4][4],_0>
                ((Matrix44<float> *)&svec,(float (*) [4] [4])(cur->field_6).m44f);
      TypedAttribute<Imath_3_2::Matrix44<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<float>_> *)&_iex_throw_s,
                 (Matrix44<float> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Matrix44<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<float>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_M44D:
      pcVar14 = cur->name;
      Imath_3_2::Matrix44<double>::Matrix44<double[4][4],_0>
                ((Matrix44<double> *)&svec,(double (*) [4] [4])(cur->field_6).m44d);
      TypedAttribute<Imath_3_2::Matrix44<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<double>_> *)&_iex_throw_s,
                 (Matrix44<double> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Matrix44<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Matrix44<double>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_PREVIEW:
      pcVar14 = cur->name;
      peVar4 = (cur->field_6).preview;
      PreviewImage::PreviewImage
                ((PreviewImage *)&svec,peVar4->width,peVar4->height,(PreviewRgba *)peVar4->rgba);
      TypedAttribute<Imf_3_4::PreviewImage>::TypedAttribute
                ((TypedAttribute<Imf_3_4::PreviewImage> *)&_iex_throw_s,(PreviewImage *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::PreviewImage>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::PreviewImage> *)&_iex_throw_s);
      PreviewImage::~PreviewImage((PreviewImage *)&svec);
      break;
    case EXR_ATTR_RATIONAL:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&((cur->field_6).box2i)->min;
      TypedAttribute<Imf_3_4::Rational>::TypedAttribute
                ((TypedAttribute<Imf_3_4::Rational> *)&_iex_throw_s,(Rational *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::Rational>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::Rational> *)&_iex_throw_s);
      break;
    case EXR_ATTR_STRING:
      pcVar14 = cur->name;
      peVar7 = ((cur->field_6).chlist)->entries;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)&svec.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&svec,peVar7,
                 peVar7->reserved + (long)((cur->field_6).chlist)->num_channels + -0x15);
      TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::TypedAttribute((TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&_iex_throw_s,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~TypedAttribute((TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&_iex_throw_s);
      std::__cxx11::string::~string((string *)&svec);
      break;
    case EXR_ATTR_STRING_VECTOR:
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&svec,(long)(((cur->field_6).box2i)->min).x);
      lVar18 = 4;
      lVar19 = 0;
      for (lVar17 = 0; lVar17 < ((cur->field_6).chlist)->num_channels; lVar17 = lVar17 + 1) {
        peVar7 = ((cur->field_6).chlist)->entries;
        lVar8 = *(long *)(peVar7->reserved + lVar18 * 2 + -0x15);
        __iex_throw_s = (undefined **)local_250;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&_iex_throw_s,lVar8,
                   *(int *)(peVar7->reserved + lVar18 * 2 + -0x1d) + lVar8);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&((svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar19)
                   ,(string *)&_iex_throw_s);
        std::__cxx11::string::~string((string *)&_iex_throw_s);
        lVar18 = lVar18 + 8;
        lVar19 = lVar19 + 0x20;
      }
      pcVar14 = cur->name;
      TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&_iex_throw_s,&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&_iex_throw_s);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&svec);
      break;
    case EXR_ATTR_TILEDESC:
      pcVar14 = cur->name;
      bVar1 = ((cur->field_6).tiledesc)->level_and_round;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(cur->field_6).tiledesc;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(ulong)(CONCAT14(bVar1 >> 4,(uint)bVar1) & 0xff0000000f);
      TypedAttribute<Imf_3_4::TileDescription>::TypedAttribute
                ((TypedAttribute<Imf_3_4::TileDescription> *)&_iex_throw_s,(TileDescription *)&svec)
      ;
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::TileDescription>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::TileDescription> *)&_iex_throw_s);
      break;
    case EXR_ATTR_TIMECODE:
      pcVar14 = cur->name;
      TimeCode::TimeCode((TimeCode *)&svec,((cur->field_6).preview)->width,
                         ((cur->field_6).preview)->height,TV60_PACKING);
      TypedAttribute<Imf_3_4::TimeCode>::TypedAttribute
                ((TypedAttribute<Imf_3_4::TimeCode> *)&_iex_throw_s,(TimeCode *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::TimeCode>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::TimeCode> *)&_iex_throw_s);
      break;
    case EXR_ATTR_V2I:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&((cur->field_6).box2i)->min;
      TypedAttribute<Imath_3_2::Vec2<int>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<int>_> *)&_iex_throw_s,(Vec2<int> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Vec2<int>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<int>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_V2F:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&((cur->field_6).box2i)->min;
      TypedAttribute<Imath_3_2::Vec2<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<float>_> *)&_iex_throw_s,(Vec2<float> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Vec2<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<float>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_V2D:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(cur->field_6).chlist;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((cur->field_6).chlist)->entries;
      TypedAttribute<Imath_3_2::Vec2<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<double>_> *)&_iex_throw_s,(Vec2<double> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Vec2<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec2<double>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_V3I:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&((cur->field_6).box2i)->min;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (((cur->field_6).box2i)->max).x);
      TypedAttribute<Imath_3_2::Vec3<int>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<int>_> *)&_iex_throw_s,(Vec3<int> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Vec3<int>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<int>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_V3F:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&((cur->field_6).box2i)->min;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (((cur->field_6).box2i)->max).x);
      TypedAttribute<Imath_3_2::Vec3<float>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<float>_> *)&_iex_throw_s,(Vec3<float> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Vec3<float>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<float>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_V3D:
      pcVar14 = cur->name;
      peVar3 = (cur->field_6).chlist;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(peVar3 + 1);
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)peVar3;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)peVar3->entries;
      TypedAttribute<Imath_3_2::Vec3<double>_>::TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<double>_> *)&_iex_throw_s,(Vec3<double> *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imath_3_2::Vec3<double>_>::~TypedAttribute
                ((TypedAttribute<Imath_3_2::Vec3<double>_> *)&_iex_throw_s);
      break;
    case EXR_ATTR_DEEP_IMAGE_STATE:
      pcVar14 = cur->name;
      svec.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(svec.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,(uint)(cur->field_6).uc
                            );
      TypedAttribute<Imf_3_4::DeepImageState>::TypedAttribute
                ((TypedAttribute<Imf_3_4::DeepImageState> *)&_iex_throw_s,(DeepImageState *)&svec);
      Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
      TypedAttribute<Imf_3_4::DeepImageState>::~TypedAttribute
                ((TypedAttribute<Imf_3_4::DeepImageState> *)&_iex_throw_s);
      break;
    case EXR_ATTR_OPAQUE:
      bVar10 = Attribute::knownType((char *)0x163e14);
      if (bVar10) {
        peVar9 = (cur->field_6).opaque;
        pcVar14 = "<mem_attr>";
        IStream::IStream((IStream *)&_iex_throw_s,"<mem_attr>");
        __iex_throw_s = &PTR__IStream_001e2fc8;
        local_238 = peVar9->packed_data;
        local_230 = (double)(long)peVar9->size;
        local_228 = (char *)0x0;
        attribute = Attribute::newAttribute((Attribute *)cur->type_name,pcVar14);
        uVar2 = ((cur->field_6).preview)->width;
        uVar13 = version(local_270);
        (*attribute->_vptr_Attribute[5])(attribute,&_iex_throw_s,(ulong)uVar2,(ulong)uVar13);
        Header::insert(__return_storage_ptr__,cur->name,attribute);
        (*attribute->_vptr_Attribute[1])(attribute);
        IStream::~IStream((IStream *)&_iex_throw_s);
      }
      else {
        pcVar14 = cur->name;
        OpaqueAttribute::OpaqueAttribute
                  ((OpaqueAttribute *)&_iex_throw_s,cur->type_name,
                   (long)((cur->field_6).opaque)->size,((cur->field_6).opaque)->packed_data);
        Header::insert(__return_storage_ptr__,pcVar14,(Attribute *)&_iex_throw_s);
        OpaqueAttribute::~OpaqueAttribute((OpaqueAttribute *)&_iex_throw_s);
      }
      break;
    default:
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      poVar16 = std::operator<<(local_250,"Unknown attribute \'");
      poVar16 = std::operator<<(poVar16,cur->name);
      poVar16 = std::operator<<(poVar16,"\' of type \'");
      poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,cur->type);
      std::operator<<(poVar16,"\', conversion to legacy header not yet implemented");
      this_01 = (LogicExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::LogicExc::LogicExc(this_01,(stringstream *)&_iex_throw_s);
      __cxa_throw(this_01,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
    }
    iVar11 = iVar11 + 1;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar16 = std::operator<<(local_250,"Unable to get attribute index ");
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,iVar11);
  poVar16 = std::operator<<(poVar16," for part ");
  poVar16 = (ostream *)std::ostream::operator<<((ostream *)poVar16,local_274);
  poVar16 = std::operator<<(poVar16," in file \'");
  pcVar14 = fileName(local_270);
  poVar16 = std::operator<<(poVar16,pcVar14);
  std::operator<<(poVar16,"\'");
  pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
  __cxa_throw(pAVar15,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

Header
Context::header (int partidx) const
{
    Header                 hdr;
    int32_t                attrcnt = 0;
    const exr_attribute_t* cur     = nullptr;

    if (EXR_ERR_SUCCESS != exr_get_attribute_count (*_ctxt, partidx, &attrcnt))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Unable to get attribute for part " << partidx << " in file '"
                                                << fileName () << "'");
    }

    for (int32_t idx = 0; idx < attrcnt; ++idx)
    {
        if (EXR_ERR_SUCCESS !=
            exr_get_attribute_by_index (
                *_ctxt, partidx, EXR_ATTR_LIST_FILE_ORDER, idx, &cur))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Unable to get attribute index " << idx << " for part "
                                                 << partidx << " in file '"
                                                 << fileName () << "'");
        }

        switch (cur->type)
        {
            case EXR_ATTR_INT:
                hdr.insert (cur->name, IntAttribute (cur->i));
                break;
            case EXR_ATTR_DOUBLE:
                hdr.insert (cur->name, DoubleAttribute (cur->d));
                break;
            case EXR_ATTR_FLOAT:
                hdr.insert (cur->name, FloatAttribute (cur->f));
                break;

            case EXR_ATTR_BOX2I:
                hdr.insert (
                    cur->name,
                    Box2iAttribute (IMATH_NAMESPACE::Box2i (
                        IMATH_NAMESPACE::V2i (cur->box2i->min),
                        IMATH_NAMESPACE::V2i (cur->box2i->max))));
                break;
            case EXR_ATTR_BOX2F:
                hdr.insert (
                    cur->name,
                    Box2fAttribute (IMATH_NAMESPACE::Box2f (
                        IMATH_NAMESPACE::V2f (cur->box2f->min),
                        IMATH_NAMESPACE::V2f (cur->box2f->max))));
                break;

            case EXR_ATTR_V2I:
                hdr.insert (
                    cur->name,
                    V2iAttribute (IMATH_NAMESPACE::V2i (*(cur->v2i))));
                break;
            case EXR_ATTR_V2F:
                hdr.insert (
                    cur->name,
                    V2fAttribute (IMATH_NAMESPACE::V2f (*(cur->v2f))));
                break;
            case EXR_ATTR_V2D:
                hdr.insert (
                    cur->name,
                    V2dAttribute (IMATH_NAMESPACE::V2d (*(cur->v2d))));
                break;
            case EXR_ATTR_V3I:
                hdr.insert (
                    cur->name,
                    V3iAttribute (IMATH_NAMESPACE::V3i (*(cur->v3i))));
                break;
            case EXR_ATTR_V3F:
                hdr.insert (
                    cur->name,
                    V3fAttribute (IMATH_NAMESPACE::V3f (*(cur->v3f))));
                break;
            case EXR_ATTR_V3D:
                hdr.insert (
                    cur->name,
                    V3dAttribute (IMATH_NAMESPACE::V3d (*(cur->v3d))));
                break;

            case EXR_ATTR_STRING:
                hdr.insert (
                    cur->name,
                    StringAttribute (
                        std::string (cur->string->str, cur->string->length)));
                break;

            case EXR_ATTR_COMPRESSION:
                hdr.insert (
                    cur->name, CompressionAttribute (Compression (cur->uc)));
                break;
            case EXR_ATTR_ENVMAP:
                hdr.insert (cur->name, EnvmapAttribute (Envmap (cur->uc)));
                break;
            case EXR_ATTR_LINEORDER:
                hdr.insert (
                    cur->name, LineOrderAttribute (LineOrder (cur->uc)));
                break;

            case EXR_ATTR_CHLIST: {
                ChannelList& chans = hdr.channels ();

                for (int c = 0; c < cur->chlist->num_channels; ++c)
                {
                    const exr_attr_chlist_entry_t& curc =
                        cur->chlist->entries[c];
                    chans.insert (
                        curc.name.str,
                        Channel (
                            PixelType (curc.pixel_type),
                            curc.x_sampling,
                            curc.y_sampling,
                            curc.p_linear != 0));
                }
                break;
            }

            case EXR_ATTR_TILEDESC:
                hdr.insert (
                    cur->name, TileDescriptionAttribute (
                        TileDescription (
                            cur->tiledesc->x_size,
                            cur->tiledesc->y_size,
                            (LevelMode)(EXR_GET_TILE_LEVEL_MODE (*cur->tiledesc)),
                            (LevelRoundingMode)(EXR_GET_TILE_ROUND_MODE (*cur->tiledesc)))));
                break;

            case EXR_ATTR_FLOAT_VECTOR:
                hdr.insert (
                    cur->name, FloatVectorAttribute (
                        FloatVector (
                            cur->floatvector->arr,
                            cur->floatvector->arr + cur->floatvector->length)));
                break;

            case EXR_ATTR_M33F:
                hdr.insert (
                    cur->name, M33fAttribute (
                        IMATH_NAMESPACE::M33f (
                            *reinterpret_cast<float (*)[3][3]> (cur->m33f->m))));
                break;
            case EXR_ATTR_M33D:
                hdr.insert (
                    cur->name, M33dAttribute (
                        IMATH_NAMESPACE::M33d (
                            *reinterpret_cast<double (*)[3][3]> (cur->m33d->m))));
                break;
            case EXR_ATTR_M44F:
                hdr.insert (
                    cur->name, M44fAttribute (
                        IMATH_NAMESPACE::M44f (
                            *reinterpret_cast<float (*)[4][4]> (cur->m44f->m))));
                break;
            case EXR_ATTR_M44D:
                hdr.insert (
                    cur->name, M44dAttribute (
                        IMATH_NAMESPACE::M44d (
                            *reinterpret_cast<double (*)[4][4]> (cur->m44d->m))));
                break;

            case EXR_ATTR_CHROMATICITIES:
                hdr.insert (
                    cur->name, ChromaticitiesAttribute (
                        Chromaticities (
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->red_x,
                                cur->chromaticities->red_y),
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->green_x,
                                cur->chromaticities->green_y),
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->blue_x,
                                cur->chromaticities->blue_y),
                            IMATH_NAMESPACE::V2f (
                                cur->chromaticities->white_x,
                                cur->chromaticities->white_y))));
                break;
            case EXR_ATTR_KEYCODE:
                hdr.insert (
                    cur->name, KeyCodeAttribute (
                        KeyCode (
                            cur->keycode->film_mfc_code,
                            cur->keycode->film_type,
                            cur->keycode->prefix,
                            cur->keycode->count,
                            cur->keycode->perf_offset,
                            cur->keycode->perfs_per_frame,
                            cur->keycode->perfs_per_count)));
                break;
            case EXR_ATTR_RATIONAL:
                hdr.insert (
                    cur->name, RationalAttribute (
                        Rational (
                            cur->rational->num,
                            cur->rational->denom)));
                break;
            case EXR_ATTR_TIMECODE:
                hdr.insert (
                    cur->name, TimeCodeAttribute (
                        TimeCode (
                            cur->timecode->time_and_flags,
                            cur->timecode->user_data)));
                break;
            case EXR_ATTR_PREVIEW:
                hdr.insert (
                    cur->name, PreviewImageAttribute (
                        PreviewImage (
                            cur->preview->width,
                            cur->preview->height,
                            reinterpret_cast<const PreviewRgba*> (cur->preview->rgba))));
                break;
            case EXR_ATTR_STRING_VECTOR:
            {
                std::vector<std::string> svec;
                svec.resize (cur->stringvector->n_strings);
                for (int s = 0; s < cur->stringvector->n_strings; ++s)
                {
                    svec[s] = std::string (
                        cur->stringvector->strings[s].str,
                        cur->stringvector->strings[s].length);
                }
                hdr.insert (
                    cur->name, StringVectorAttribute (svec));
                break;
            }

            case EXR_ATTR_DEEP_IMAGE_STATE:
                hdr.insert (
                    cur->name, DeepImageStateAttribute (DeepImageState (cur->uc)));
                break;

            case EXR_ATTR_OPAQUE:
                if (Attribute::knownType (cur->type_name))
                {
                    MemAttrStream mas {cur->opaque};

                    std::unique_ptr<Attribute> attr;
                    attr.reset (Attribute::newAttribute (cur->type_name));

                    attr->readValueFrom (mas, cur->opaque->size, version ());
                    // TODO: can we avoid a double copy?
                    hdr.insert (cur->name, *attr);
                }
                else
                {
                    hdr.insert (
                        cur->name, OpaqueAttribute (
                            cur->type_name,
                            cur->opaque->size,
                            cur->opaque->packed_data));
                }
                break;

            case EXR_ATTR_UNKNOWN:
            case EXR_ATTR_LAST_KNOWN_TYPE:
            default: {
                THROW (IEX_NAMESPACE::LogicExc,
                       "Unknown attribute '"
                       << cur->name
                       << "' of type '"
                       << cur->type << "', conversion to legacy header not yet implemented");
            }
        }
    }

    return hdr;
}